

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_tattle(REF_GEOM ref_geom,REF_INT node)

{
  int iVar1;
  REF_ADJ pRVar2;
  REF_INT *pRVar3;
  REF_ADJ_ITEM pRVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  
  printf(" tattle on node = %d\n");
  uVar8 = 0xffffffff;
  uVar7 = 0xffffffff;
  if (-1 < node) {
    pRVar2 = ref_geom->ref_adj;
    uVar8 = 0xffffffff;
    uVar7 = 0xffffffff;
    if (node < pRVar2->nnode) {
      uVar5 = pRVar2->first[(uint)node];
      uVar8 = 0xffffffff;
      uVar7 = 0xffffffff;
      if ((long)(int)uVar5 != -1) {
        uVar7 = (ulong)(uint)pRVar2->item[(int)uVar5].ref;
        uVar8 = (ulong)uVar5;
      }
    }
  }
  while ((int)uVar8 != -1) {
    pRVar3 = ref_geom->descr;
    iVar6 = (int)uVar7;
    uVar5 = iVar6 * 6;
    iVar1 = pRVar3[(int)uVar5];
    if (iVar1 == 2) {
      printf("%d face: %d id, %d jump, %d degen, %d global, uv= %e %e\n",ref_geom->param[iVar6 * 2],
             ref_geom->param[iVar6 * 2 + 1],uVar7,(ulong)(uint)pRVar3[(int)(uVar5 | 1)],
             (ulong)(uint)pRVar3[(long)(int)uVar5 + 3],(ulong)(uint)pRVar3[(long)(int)uVar5 + 4],
             (ulong)(uint)pRVar3[(long)(int)uVar5 + 5]);
    }
    else if (iVar1 == 1) {
      printf("%d edge: %d id, %d jump, %d degen, %d global, t=%e\n",ref_geom->param[iVar6 * 2],uVar7
             ,(ulong)(uint)pRVar3[(int)(uVar5 | 1)],(ulong)(uint)pRVar3[(long)(int)uVar5 + 3],
             (ulong)(uint)pRVar3[(long)(int)uVar5 + 4],(ulong)(uint)pRVar3[(long)(int)uVar5 + 5]);
    }
    else if (iVar1 == 0) {
      printf("%d node: %d id, %d jump, %d degen, %d global\n",uVar7,
             (ulong)(uint)pRVar3[(int)(uVar5 | 1)],(ulong)(uint)pRVar3[(long)(int)uVar5 + 3],
             (ulong)(uint)pRVar3[(long)(int)uVar5 + 4],(ulong)(uint)pRVar3[(long)(int)uVar5 + 5]);
    }
    pRVar4 = ref_geom->ref_adj->item;
    uVar8 = (ulong)pRVar4[(int)uVar8].next;
    uVar7 = 0xffffffff;
    if (uVar8 != 0xffffffffffffffff) {
      uVar7 = (ulong)(uint)pRVar4[uVar8].ref;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tattle(REF_GEOM ref_geom, REF_INT node) {
  REF_INT item, geom;

  printf(" tattle on node = %d\n", node);
  each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node, item, geom) {
    switch (ref_geom_type(ref_geom, geom)) {
      case REF_GEOM_NODE:
        printf("%d node: %d id, %d jump, %d degen, %d global\n", geom,
               ref_geom_id(ref_geom, geom), ref_geom_jump(ref_geom, geom),
               ref_geom_degen(ref_geom, geom), ref_geom_node(ref_geom, geom));
        break;
      case REF_GEOM_EDGE:
        printf("%d edge: %d id, %d jump, %d degen, %d global, t=%e\n", geom,
               ref_geom_id(ref_geom, geom), ref_geom_jump(ref_geom, geom),
               ref_geom_degen(ref_geom, geom), ref_geom_node(ref_geom, geom),
               ref_geom_param(ref_geom, 0, geom));
        break;
      case REF_GEOM_FACE:
        printf("%d face: %d id, %d jump, %d degen, %d global, uv= %e %e\n",
               geom, ref_geom_id(ref_geom, geom), ref_geom_jump(ref_geom, geom),
               ref_geom_degen(ref_geom, geom), ref_geom_node(ref_geom, geom),
               ref_geom_param(ref_geom, 0, geom),
               ref_geom_param(ref_geom, 1, geom));
        break;
    }
  }

  return REF_SUCCESS;
}